

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::_::DebugComparison<char&,char&>&>
          (String *__return_storage_ptr__,kj *this,DebugComparison<char_&,_char_&> *params)

{
  FixedArray<char,_1UL> *in_R8;
  undefined1 local_2a;
  _ local_29;
  String local_28;
  
  local_29 = **(_ **)this;
  local_2a = **(undefined1 **)(this + 8);
  _::concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::FixedArray<char,1ul>>
            (&local_28,&local_29,(FixedArray<char,_1UL> *)(this + 0x10),(StringPtr *)&local_2a,in_R8
            );
  (__return_storage_ptr__->content).ptr = local_28.content.ptr;
  (__return_storage_ptr__->content).size_ = local_28.content.size_;
  (__return_storage_ptr__->content).disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}